

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindowSettings * ImGui::FindWindowSettingsByID(ImGuiID id)

{
  int iVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiWindowSettings *pIVar3;
  
  pIVar2 = (ImGuiWindowSettings *)(GImGui->SettingsWindows).Buf.Data;
  pIVar3 = pIVar2;
  if (pIVar2 != (ImGuiWindowSettings *)0x0) {
    pIVar3 = (ImGuiWindowSettings *)&pIVar2->Pos;
  }
  while ((pIVar3 != (ImGuiWindowSettings *)0x0 &&
         ((pIVar3->ID != id || (pIVar3->WantDelete == true))))) {
    iVar1._0_1_ = pIVar3[-1].Collapsed;
    iVar1._1_1_ = pIVar3[-1].IsChild;
    iVar1._2_1_ = pIVar3[-1].WantApply;
    iVar1._3_1_ = pIVar3[-1].WantDelete;
    pIVar3 = (ImGuiWindowSettings *)((long)&pIVar3->ID + (long)iVar1);
    if (pIVar3 == (ImGuiWindowSettings *)
                  ((long)&(pIVar2->Pos).x + (long)(GImGui->SettingsWindows).Buf.Size)) {
      pIVar3 = (ImGuiWindowSettings *)0x0;
    }
  }
  return pIVar3;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettingsByID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id && !settings->WantDelete)
            return settings;
    return NULL;
}